

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

void __thiscall xercesc_4_0::ElemStack::~ElemStack(ElemStack *this)

{
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *this_00;
  PrefMapElem *p;
  XMLCh *p_00;
  StackElem **p_01;
  ulong uVar1;
  
  if (this->fGlobalNamespaces != (StackElem *)0x0) {
    p = this->fGlobalNamespaces->fMap;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    XMemory::operator_delete((XMemory *)this->fGlobalNamespaces,p);
  }
  if (this->fStackCapacity != 0) {
    uVar1 = 0;
    do {
      if (this->fStack[uVar1] == (StackElem *)0x0) break;
      (*this->fMemoryManager->_vptr_MemoryManager[4])
                (this->fMemoryManager,this->fStack[uVar1]->fChildren);
      (*this->fMemoryManager->_vptr_MemoryManager[4])
                (this->fMemoryManager,this->fStack[uVar1]->fMap);
      p_00 = this->fStack[uVar1]->fSchemaElemName;
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
      XMemory::operator_delete((XMemory *)this->fStack[uVar1],p_00);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->fStackCapacity);
  }
  p_01 = this->fStack;
  (*this->fMemoryManager->_vptr_MemoryManager[4])();
  this_00 = this->fNamespaceMap;
  if (this_00 != (ValueVectorOf<xercesc_4_0::PrefMapElem_*> *)0x0) {
    p_01 = (StackElem **)this_00->fElemList;
    (*this_00->fMemoryManager->_vptr_MemoryManager[4])();
  }
  XMemory::operator_delete((XMemory *)this_00,p_01);
  XMLStringPool::~XMLStringPool(&this->fPrefixPool);
  return;
}

Assistant:

ElemStack::~ElemStack()
{
    if(fGlobalNamespaces)
    {
        fMemoryManager->deallocate(fGlobalNamespaces->fMap);
        delete fGlobalNamespaces;
    }

    //
    //  Start working from the bottom of the stack and clear it out as we
    //  go up. Once we hit an uninitialized one, we can break out.
    //
    for (XMLSize_t stackInd = 0; stackInd < fStackCapacity; stackInd++)
    {
        // If this entry has been set, then lets clean it up
        if (!fStack[stackInd])
            break;

        fMemoryManager->deallocate(fStack[stackInd]->fChildren);//delete [] fStack[stackInd]->fChildren;
        fMemoryManager->deallocate(fStack[stackInd]->fMap);//delete [] fStack[stackInd]->fMap;
        fMemoryManager->deallocate(fStack[stackInd]->fSchemaElemName);
        delete fStack[stackInd];
    }

    // Delete the stack array itself now
    fMemoryManager->deallocate(fStack);//delete [] fStack;
    delete fNamespaceMap;
}